

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall ObjectTest_basic_set_set_Test::TestBody(ObjectTest_basic_set_set_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_fd8 [8];
  Message local_fd0 [8];
  set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_> local_fc8;
  set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_> local_f98;
  set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_> local_f60;
  undefined1 local_f30 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_f00 [8];
  Message local_ef8 [15];
  bool local_ee9;
  undefined1 local_ee8 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_ea8 [8];
  Message local_ea0 [8];
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_e98;
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_e68;
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  local_e30;
  undefined1 local_e00 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_dd0 [8];
  Message local_dc8 [15];
  bool local_db9;
  undefined1 local_db8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_d78 [8];
  Message local_d70 [8];
  set<long_double,_std::less<long_double>,_std::allocator<long_double>_> local_d68;
  set<long_double,_std::less<long_double>,_std::allocator<long_double>_> local_d38;
  set<long_double,_std::less<long_double>,_std::allocator<long_double>_> local_d00;
  undefined1 local_cd0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_ca0 [8];
  Message local_c98 [15];
  bool local_c89;
  undefined1 local_c88 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_c48 [8];
  Message local_c40 [8];
  set<double,_std::less<double>,_std::allocator<double>_> local_c38;
  set<double,_std::less<double>,_std::allocator<double>_> local_c08;
  set<double,_std::less<double>,_std::allocator<double>_> local_bd0;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_b70 [8];
  Message local_b68 [15];
  bool local_b59;
  undefined1 local_b58 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_b18 [8];
  Message local_b10 [8];
  set<float,_std::less<float>,_std::allocator<float>_> local_b08;
  set<float,_std::less<float>,_std::allocator<float>_> local_ad8;
  set<float,_std::less<float>,_std::allocator<float>_> local_aa0;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_a40 [8];
  Message local_a38 [15];
  bool local_a29;
  undefined1 local_a28 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_9e8 [8];
  Message local_9e0 [8];
  set<long,_std::less<long>,_std::allocator<long>_> local_9d8;
  set<long,_std::less<long>,_std::allocator<long>_> local_9a8;
  set<long,_std::less<long>,_std::allocator<long>_> local_970;
  undefined1 local_940 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_910 [8];
  Message local_908 [15];
  bool local_8f9;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_8b8 [8];
  Message local_8b0 [8];
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> local_8a8;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> local_878;
  set<long_long,_std::less<long_long>,_std::allocator<long_long>_> local_840;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_7e0 [8];
  Message local_7d8 [15];
  bool local_7c9;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_788 [8];
  Message local_780 [8];
  set<long,_std::less<long>,_std::allocator<long>_> local_778;
  set<long,_std::less<long>,_std::allocator<long>_> local_748;
  set<long,_std::less<long>,_std::allocator<long>_> local_710;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_6b0 [8];
  Message local_6a8 [15];
  bool local_699;
  undefined1 local_698 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_658 [8];
  Message local_650 [8];
  set<int,_std::less<int>,_std::allocator<int>_> local_648;
  set<int,_std::less<int>,_std::allocator<int>_> local_618;
  set<int,_std::less<int>,_std::allocator<int>_> local_5e0;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_580 [8];
  Message local_578 [15];
  bool local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_528 [8];
  Message local_520 [8];
  set<short,_std::less<short>,_std::allocator<short>_> local_518;
  set<short,_std::less<short>,_std::allocator<short>_> local_4e8;
  set<short,_std::less<short>,_std::allocator<short>_> local_4b0;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_450 [8];
  Message local_448 [15];
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_3f8 [8];
  Message local_3f0 [8];
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> local_3e8;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> local_3b8;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> local_380;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_320 [8];
  Message local_318 [15];
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2c8 [8];
  Message local_2c0 [8];
  set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> local_2b8;
  set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> local_288;
  set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> local_250;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1f0 [8];
  Message local_1e8 [15];
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_198 [8];
  Message local_190 [8];
  set<bool,_std::less<bool>,_std::allocator<bool>_> local_188;
  set<bool,_std::less<bool>,_std::allocator<bool>_> local_158;
  set<bool,_std::less<bool>,_std::allocator<bool>_> local_120;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_c0 [8];
  Message local_b8 [15];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  set<bool,_std::less<bool>,_std::allocator<bool>_> local_88;
  undefined1 local_58 [8];
  object obj;
  ObjectTest_basic_set_set_Test *this_local;
  
  jessilib::object::object((object *)local_58);
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_88._M_t._M_impl._0_8_ = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<bool,_std::less<bool>,_std::allocator<bool>_>::set(&local_88);
  jessilib::object::set<std::set<bool,_std::less<bool>,_std::allocator<bool>_>,_nullptr>
            ((object *)local_58,&local_88);
  std::set<bool,_std::less<bool>,_std::allocator<bool>_>::~set(&local_88);
  local_a9 = jessilib::object::has<std::set<bool,std::less<bool>,std::allocator<bool>>>
                       ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_a8,"obj .has< std::set<bool> >()","false"
              );
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x240,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_158._M_t._M_impl._0_8_ = 0;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_158._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<bool,_std::less<bool>,_std::allocator<bool>_>::set(&local_158);
  jessilib::object::
  get<std::set<bool,_std::less<bool>,_std::allocator<bool>_>,_std::set<bool,_std::less<bool>,_std::allocator<bool>_>,_nullptr>
            (&local_120,(object *)local_58,&local_158);
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_188._M_t._M_impl._0_8_ = 0;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_188._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<bool,_std::less<bool>,_std::allocator<bool>_>::set(&local_188);
  testing::internal::EqHelper::
  Compare<std::set<bool,_std::less<bool>,_std::allocator<bool>_>,_std::set<bool,_std::less<bool>,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_f0,"obj .get< std::set<bool> >()","std::set<bool> {}",&local_120,
             &local_188);
  std::set<bool,_std::less<bool>,_std::allocator<bool>_>::~set(&local_188);
  std::set<bool,_std::less<bool>,_std::allocator<bool>_>::~set(&local_120);
  std::set<bool,_std::less<bool>,_std::allocator<bool>_>::~set(&local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x240,pcVar2);
    testing::internal::AssertHelper::operator=(local_198,local_190);
    testing::internal::AssertHelper::~AssertHelper(local_198);
    testing::Message::~Message(local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::set
            ((set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)
             &gtest_ar__1.message_);
  jessilib::object::
  set<std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_58,
             (set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)
             &gtest_ar__1.message_);
  std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::~set
            ((set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_> *)
             &gtest_ar__1.message_);
  local_1d9 = jessilib::object::
              has<std::set<signed_char,std::less<signed_char>,std::allocator<signed_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_1d8,
               "obj .has< std::set<signed char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_1.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x241,pcVar2);
    testing::internal::AssertHelper::operator=(local_1f0,local_1e8);
    testing::internal::AssertHelper::~AssertHelper(local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_288._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_288._M_t._M_impl._0_8_ = 0;
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_288._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::set(&local_288);
  jessilib::object::
  get<std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            (&local_250,(object *)local_58,&local_288);
  local_2b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_2b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_2b8._M_t._M_impl._0_8_ = 0;
  local_2b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::set(&local_2b8);
  testing::internal::EqHelper::
  Compare<std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>,_nullptr>
            ((EqHelper *)local_220,"obj .get< std::set<signed char> >()","std::set<signed char> {}",
             &local_250,&local_2b8);
  std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::~set(&local_2b8);
  std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::~set(&local_250);
  std::set<signed_char,_std::less<signed_char>,_std::allocator<signed_char>_>::~set(&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x241,pcVar2);
    testing::internal::AssertHelper::operator=(local_2c8,local_2c0);
    testing::internal::AssertHelper::~AssertHelper(local_2c8);
    testing::Message::~Message(local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set
            ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             &gtest_ar__2.message_);
  jessilib::object::
  set<std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_58,
             (set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             &gtest_ar__2.message_);
  std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~set
            ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
             &gtest_ar__2.message_);
  local_309 = jessilib::object::
              has<std::set<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_308,
               "obj .has< std::set<unsigned char> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_2.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x242,pcVar2);
    testing::internal::AssertHelper::operator=(local_320,local_318);
    testing::internal::AssertHelper::~AssertHelper(local_320);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_3b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_3b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_3b8._M_t._M_impl._0_8_ = 0;
  local_3b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set(&local_3b8)
  ;
  jessilib::object::
  get<std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            (&local_380,(object *)local_58,&local_3b8);
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_3e8._M_t._M_impl._0_8_ = 0;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set(&local_3e8)
  ;
  testing::internal::EqHelper::
  Compare<std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_350,"obj .get< std::set<unsigned char> >()",
             "std::set<unsigned char> {}",&local_380,&local_3e8);
  std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~set
            (&local_3e8);
  std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~set
            (&local_380);
  std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~set
            (&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              (local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x242,pcVar2);
    testing::internal::AssertHelper::operator=(local_3f8,local_3f0);
    testing::internal::AssertHelper::~AssertHelper(local_3f8);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<short,_std::less<short>,_std::allocator<short>_>::set
            ((set<short,_std::less<short>,_std::allocator<short>_> *)&gtest_ar__3.message_);
  jessilib::object::set<std::set<short,_std::less<short>,_std::allocator<short>_>,_nullptr>
            ((object *)local_58,
             (set<short,_std::less<short>,_std::allocator<short>_> *)&gtest_ar__3.message_);
  std::set<short,_std::less<short>,_std::allocator<short>_>::~set
            ((set<short,_std::less<short>,_std::allocator<short>_> *)&gtest_ar__3.message_);
  local_439 = jessilib::object::has<std::set<short,std::less<short>,std::allocator<short>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(local_448);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_3.message_,local_438,"obj .has< std::set<short> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_3.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x243,pcVar2);
    testing::internal::AssertHelper::operator=(local_450,local_448);
    testing::internal::AssertHelper::~AssertHelper(local_450);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  local_4e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_4e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_4e8._M_t._M_impl._0_8_ = 0;
  local_4e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4e8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<short,_std::less<short>,_std::allocator<short>_>::set(&local_4e8);
  jessilib::object::
  get<std::set<short,_std::less<short>,_std::allocator<short>_>,_std::set<short,_std::less<short>,_std::allocator<short>_>,_nullptr>
            (&local_4b0,(object *)local_58,&local_4e8);
  local_518._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_518._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_518._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_518._M_t._M_impl._0_8_ = 0;
  local_518._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<short,_std::less<short>,_std::allocator<short>_>::set(&local_518);
  testing::internal::EqHelper::
  Compare<std::set<short,_std::less<short>,_std::allocator<short>_>,_std::set<short,_std::less<short>,_std::allocator<short>_>,_nullptr>
            ((EqHelper *)local_480,"obj .get< std::set<short> >()","std::set<short> {}",&local_4b0,
             &local_518);
  std::set<short,_std::less<short>,_std::allocator<short>_>::~set(&local_518);
  std::set<short,_std::less<short>,_std::allocator<short>_>::~set(&local_4b0);
  std::set<short,_std::less<short>,_std::allocator<short>_>::~set(&local_4e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(local_520);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              (local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x243,pcVar2);
    testing::internal::AssertHelper::operator=(local_528,local_520);
    testing::internal::AssertHelper::~AssertHelper(local_528);
    testing::Message::~Message(local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&gtest_ar__4.message_);
  jessilib::object::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_nullptr>
            ((object *)local_58,
             (set<int,_std::less<int>,_std::allocator<int>_> *)&gtest_ar__4.message_);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&gtest_ar__4.message_);
  local_569 = jessilib::object::has<std::set<int,std::less<int>,std::allocator<int>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_568,&local_569,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_4.message_,local_568,"obj .has< std::set<int> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_4.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x244,pcVar2);
    testing::internal::AssertHelper::operator=(local_580,local_578);
    testing::internal::AssertHelper::~AssertHelper(local_580);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  local_618._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_618._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_618._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_618._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_618._M_t._M_impl._0_8_ = 0;
  local_618._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_618._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_618);
  jessilib::object::
  get<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_nullptr>
            (&local_5e0,(object *)local_58,&local_618);
  local_648._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_648._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_648._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_648._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_648._M_t._M_impl._0_8_ = 0;
  local_648._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_648._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_648);
  testing::internal::EqHelper::
  Compare<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_5b0,"obj .get< std::set<int> >()","std::set<int> {}",&local_5e0,
             &local_648);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_648);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_5e0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(local_650);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              (local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x244,pcVar2);
    testing::internal::AssertHelper::operator=(local_658,local_650);
    testing::internal::AssertHelper::~AssertHelper(local_658);
    testing::Message::~Message(local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  gtest_ar__5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&gtest_ar__5.message_);
  jessilib::object::set<std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&gtest_ar__5.message_);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&gtest_ar__5.message_);
  local_699 = jessilib::object::has<std::set<long,std::less<long>,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_698,&local_699,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar1) {
    testing::Message::Message(local_6a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_5.message_,local_698,"obj .has< std::set<long> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_5.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=(local_6b0,local_6a8);
    testing::internal::AssertHelper::~AssertHelper(local_6b0);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  local_748._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_748._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_748._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_748._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_748._M_t._M_impl._0_8_ = 0;
  local_748._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_748._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_748);
  jessilib::object::
  get<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            (&local_710,(object *)local_58,&local_748);
  local_778._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_778._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_778._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_778._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_778._M_t._M_impl._0_8_ = 0;
  local_778._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_778._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_778);
  testing::internal::EqHelper::
  Compare<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_6e0,"obj .get< std::set<long> >()","std::set<long> {}",&local_710,
             &local_778);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_778);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_710);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_748);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(local_780);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              (local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x245,pcVar2);
    testing::internal::AssertHelper::operator=(local_788,local_780);
    testing::internal::AssertHelper::~AssertHelper(local_788);
    testing::Message::~Message(local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  gtest_ar__6.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::set
            ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
             &gtest_ar__6.message_);
  jessilib::object::
  set<std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_58,
             (set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
             &gtest_ar__6.message_);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set
            ((set<long_long,_std::less<long_long>,_std::allocator<long_long>_> *)
             &gtest_ar__6.message_);
  local_7c9 = jessilib::object::
              has<std::set<long_long,std::less<long_long>,std::allocator<long_long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c8,&local_7c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar1) {
    testing::Message::Message(local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_6.message_,local_7c8,"obj .has< std::set<long long> >()"
               ,"false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_6.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x246,pcVar2);
    testing::internal::AssertHelper::operator=(local_7e0,local_7d8);
    testing::internal::AssertHelper::~AssertHelper(local_7e0);
    std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
    testing::Message::~Message(local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_878._M_t._M_impl._0_8_ = 0;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_878._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::set(&local_878);
  jessilib::object::
  get<std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_nullptr>
            (&local_840,(object *)local_58,&local_878);
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_8a8._M_t._M_impl._0_8_ = 0;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_8a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::set(&local_8a8);
  testing::internal::EqHelper::
  Compare<std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>,_nullptr>
            ((EqHelper *)local_810,"obj .get< std::set<long long> >()","std::set<long long> {}",
             &local_840,&local_8a8);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set(&local_8a8);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set(&local_840);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set(&local_878);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar1) {
    testing::Message::Message(local_8b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              (local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x246,pcVar2);
    testing::internal::AssertHelper::operator=(local_8b8,local_8b0);
    testing::internal::AssertHelper::~AssertHelper(local_8b8);
    testing::Message::~Message(local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&gtest_ar__7.message_);
  jessilib::object::set<std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((object *)local_58,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&gtest_ar__7.message_);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&gtest_ar__7.message_);
  local_8f9 = jessilib::object::has<std::set<long,std::less<long>,std::allocator<long>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f8,&local_8f9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f8);
  if (!bVar1) {
    testing::Message::Message(local_908);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_7.message_,local_8f8,"obj .has< std::set<intmax_t> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_7.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x247,pcVar2);
    testing::internal::AssertHelper::operator=(local_910,local_908);
    testing::internal::AssertHelper::~AssertHelper(local_910);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f8);
  local_9a8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_9a8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_9a8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_9a8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_9a8._M_t._M_impl._0_8_ = 0;
  local_9a8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_9a8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_9a8);
  jessilib::object::
  get<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            (&local_970,(object *)local_58,&local_9a8);
  local_9d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_9d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_9d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_9d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_9d8._M_t._M_impl._0_8_ = 0;
  local_9d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_9d8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_9d8);
  testing::internal::EqHelper::
  Compare<std::set<long,_std::less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>,_nullptr>
            ((EqHelper *)local_940,"obj .get< std::set<intmax_t> >()","std::set<intmax_t> {}",
             &local_970,&local_9d8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_9d8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_970);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_9a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(local_9e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_940);
    testing::internal::AssertHelper::AssertHelper
              (local_9e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x247,pcVar2);
    testing::internal::AssertHelper::operator=(local_9e8,local_9e0);
    testing::internal::AssertHelper::~AssertHelper(local_9e8);
    testing::Message::~Message(local_9e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<float,_std::less<float>,_std::allocator<float>_>::set
            ((set<float,_std::less<float>,_std::allocator<float>_> *)&gtest_ar__8.message_);
  jessilib::object::set<std::set<float,_std::less<float>,_std::allocator<float>_>,_nullptr>
            ((object *)local_58,
             (set<float,_std::less<float>,_std::allocator<float>_> *)&gtest_ar__8.message_);
  std::set<float,_std::less<float>,_std::allocator<float>_>::~set
            ((set<float,_std::less<float>,_std::allocator<float>_> *)&gtest_ar__8.message_);
  local_a29 = jessilib::object::has<std::set<float,std::less<float>,std::allocator<float>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a28,&local_a29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a28);
  if (!bVar1) {
    testing::Message::Message(local_a38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_8.message_,local_a28,"obj .has< std::set<float> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_8.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=(local_a40,local_a38);
    testing::internal::AssertHelper::~AssertHelper(local_a40);
    std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
    testing::Message::~Message(local_a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a28);
  local_ad8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_ad8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_ad8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_ad8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_ad8._M_t._M_impl._0_8_ = 0;
  local_ad8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_ad8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<float,_std::less<float>,_std::allocator<float>_>::set(&local_ad8);
  jessilib::object::
  get<std::set<float,_std::less<float>,_std::allocator<float>_>,_std::set<float,_std::less<float>,_std::allocator<float>_>,_nullptr>
            (&local_aa0,(object *)local_58,&local_ad8);
  local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_b08._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_b08._M_t._M_impl._0_8_ = 0;
  local_b08._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b08._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<float,_std::less<float>,_std::allocator<float>_>::set(&local_b08);
  testing::internal::EqHelper::
  Compare<std::set<float,_std::less<float>,_std::allocator<float>_>,_std::set<float,_std::less<float>,_std::allocator<float>_>,_nullptr>
            ((EqHelper *)local_a70,"obj .get< std::set<float> >()","std::set<float> {}",&local_aa0,
             &local_b08);
  std::set<float,_std::less<float>,_std::allocator<float>_>::~set(&local_b08);
  std::set<float,_std::less<float>,_std::allocator<float>_>::~set(&local_aa0);
  std::set<float,_std::less<float>,_std::allocator<float>_>::~set(&local_ad8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar1) {
    testing::Message::Message(local_b10);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
    testing::internal::AssertHelper::AssertHelper
              (local_b18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=(local_b18,local_b10);
    testing::internal::AssertHelper::~AssertHelper(local_b18);
    testing::Message::~Message(local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  gtest_ar__9.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<double,_std::less<double>,_std::allocator<double>_>::set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)&gtest_ar__9.message_);
  jessilib::object::set<std::set<double,_std::less<double>,_std::allocator<double>_>,_nullptr>
            ((object *)local_58,
             (set<double,_std::less<double>,_std::allocator<double>_> *)&gtest_ar__9.message_);
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)&gtest_ar__9.message_);
  local_b59 = jessilib::object::has<std::set<double,std::less<double>,std::allocator<double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b58,&local_b59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
  if (!bVar1) {
    testing::Message::Message(local_b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_9.message_,local_b58,"obj .has< std::set<double> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_9.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x249,pcVar2);
    testing::internal::AssertHelper::operator=(local_b70,local_b68);
    testing::internal::AssertHelper::~AssertHelper(local_b70);
    std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
    testing::Message::~Message(local_b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
  local_c08._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_c08._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c08._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c08._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_c08._M_t._M_impl._0_8_ = 0;
  local_c08._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c08._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<double,_std::less<double>,_std::allocator<double>_>::set(&local_c08);
  jessilib::object::
  get<std::set<double,_std::less<double>,_std::allocator<double>_>,_std::set<double,_std::less<double>,_std::allocator<double>_>,_nullptr>
            (&local_bd0,(object *)local_58,&local_c08);
  local_c38._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_c38._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c38._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c38._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_c38._M_t._M_impl._0_8_ = 0;
  local_c38._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c38._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<double,_std::less<double>,_std::allocator<double>_>::set(&local_c38);
  testing::internal::EqHelper::
  Compare<std::set<double,_std::less<double>,_std::allocator<double>_>,_std::set<double,_std::less<double>,_std::allocator<double>_>,_nullptr>
            ((EqHelper *)local_ba0,"obj .get< std::set<double> >()","std::set<double> {}",&local_bd0
             ,&local_c38);
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set(&local_c38);
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set(&local_bd0);
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set(&local_c08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
  if (!bVar1) {
    testing::Message::Message(local_c40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ba0);
    testing::internal::AssertHelper::AssertHelper
              (local_c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x249,pcVar2);
    testing::internal::AssertHelper::operator=(local_c48,local_c40);
    testing::internal::AssertHelper::~AssertHelper(local_c48);
    testing::Message::~Message(local_c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
  gtest_ar__10.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>::set
            ((set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)
             &gtest_ar__10.message_);
  jessilib::object::
  set<std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_58,
             (set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)
             &gtest_ar__10.message_);
  std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>::~set
            ((set<long_double,_std::less<long_double>,_std::allocator<long_double>_> *)
             &gtest_ar__10.message_);
  local_c89 = jessilib::object::
              has<std::set<long_double,std::less<long_double>,std::allocator<long_double>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c88,&local_c89,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c88);
  if (!bVar1) {
    testing::Message::Message(local_c98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_10.message_,local_c88,
               "obj .has< std::set<long double> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_10.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_ca0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=(local_ca0,local_c98);
    testing::internal::AssertHelper::~AssertHelper(local_ca0);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(local_c98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c88);
  local_d38._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_d38._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d38._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d38._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_d38._M_t._M_impl._0_8_ = 0;
  local_d38._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d38._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>::set(&local_d38);
  jessilib::object::
  get<std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_nullptr>
            (&local_d00,(object *)local_58,&local_d38);
  local_d68._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_d68._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d68._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_d68._M_t._M_impl._0_8_ = 0;
  local_d68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>::set(&local_d68);
  testing::internal::EqHelper::
  Compare<std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>,_nullptr>
            ((EqHelper *)local_cd0,"obj .get< std::set<long double> >()","std::set<long double> {}",
             &local_d00,&local_d68);
  std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>::~set(&local_d68);
  std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>::~set(&local_d00);
  std::set<long_double,_std::less<long_double>,_std::allocator<long_double>_>::~set(&local_d38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd0);
  if (!bVar1) {
    testing::Message::Message(local_d70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cd0);
    testing::internal::AssertHelper::AssertHelper
              (local_d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=(local_d78,local_d70);
    testing::internal::AssertHelper::~AssertHelper(local_d78);
    testing::Message::~Message(local_d70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::set((set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
         *)&gtest_ar__11.message_);
  jessilib::object::
  set<std::set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_58,
             (set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&gtest_ar__11.message_);
  std::
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
          *)&gtest_ar__11.message_);
  local_db9 = jessilib::object::
              has<std::set<std::__cxx11::u8string,std::less<std::__cxx11::u8string>,std::allocator<std::__cxx11::u8string>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_db8,&local_db9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
  if (!bVar1) {
    testing::Message::Message(local_dc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_11.message_,local_db8,
               "obj .has< std::set<std::u8string> >()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_11.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_dd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24b,pcVar2);
    testing::internal::AssertHelper::operator=(local_dd0,local_dc8);
    testing::internal::AssertHelper::~AssertHelper(local_dd0);
    std::__cxx11::string::~string((string *)&gtest_ar_11.message_);
    testing::Message::~Message(local_dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
  local_e68._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_e68._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e68._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_e68._M_t._M_impl._0_8_ = 0;
  local_e68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::set(&local_e68);
  jessilib::object::
  get<std::set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            (&local_e30,(object *)local_58,&local_e68);
  local_e98._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_e98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e98._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_e98._M_t._M_impl._0_8_ = 0;
  local_e98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e98._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::set(&local_e98);
  testing::internal::EqHelper::
  Compare<std::set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((EqHelper *)local_e00,"obj .get< std::set<std::u8string> >()",
             "std::set<std::u8string> {}",&local_e30,&local_e98);
  std::
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~set(&local_e98);
  std::
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~set(&local_e30);
  std::
  set<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~set(&local_e68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e00);
  if (!bVar1) {
    testing::Message::Message(local_ea0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e00);
    testing::internal::AssertHelper::AssertHelper
              (local_ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24b,pcVar2);
    testing::internal::AssertHelper::operator=(local_ea8,local_ea0);
    testing::internal::AssertHelper::~AssertHelper(local_ea8);
    testing::Message::~Message(local_ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e00);
  gtest_ar__12.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::set
            ((set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&gtest_ar__12.message_);
  jessilib::object::
  set<std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_58,
             (set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&gtest_ar__12.message_);
  std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::~set
            ((set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
              *)&gtest_ar__12.message_);
  local_ee9 = jessilib::object::
              has<std::set<jessilib::object,std::less<jessilib::object>,std::allocator<jessilib::object>>>
                        ((object *)local_58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ee8,&local_ee9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ee8);
  if (!bVar1) {
    testing::Message::Message(local_ef8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_12.message_,local_ee8,"obj .has< std::set<object> >()",
               "false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_ar_12.message_);
    testing::internal::AssertHelper::AssertHelper
              (local_f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=(local_f00,local_ef8);
    testing::internal::AssertHelper::~AssertHelper(local_f00);
    std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
    testing::Message::~Message(local_ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ee8);
  local_f98._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_f98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f98._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_f98._M_t._M_impl._0_8_ = 0;
  local_f98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f98._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::set
            (&local_f98);
  jessilib::object::
  get<std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            (&local_f60,(object *)local_58,&local_f98);
  local_fc8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_fc8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_fc8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_fc8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_fc8._M_t._M_impl._0_8_ = 0;
  local_fc8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_fc8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::set
            (&local_fc8);
  testing::internal::EqHelper::
  Compare<std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>,_nullptr>
            ((EqHelper *)local_f30,"obj .get< std::set<object> >()","std::set<object> {}",&local_f60
             ,&local_fc8);
  std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::~set
            (&local_fc8);
  std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::~set
            (&local_f60);
  std::set<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>::~set
            (&local_f98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f30);
  if (!bVar1) {
    testing::Message::Message(local_fd0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f30);
    testing::internal::AssertHelper::AssertHelper
              (local_fd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=(local_fd8,local_fd0);
    testing::internal::AssertHelper::~AssertHelper(local_fd8);
    testing::Message::~Message(local_fd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f30);
  jessilib::object::~object((object *)local_58);
  return;
}

Assistant:

TEST(ObjectTest, basic_set_set) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::set<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::set<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::set<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::set<short>);
	OBJECT_BASIC_SET_TEST(obj, std::set<int>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::set<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::set<float>);
	OBJECT_BASIC_SET_TEST(obj, std::set<double>);
	OBJECT_BASIC_SET_TEST(obj, std::set<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::set<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::set<object>);
}